

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdRotate(Kit_DsdNtk_t *p,int *pFreqs)

{
  undefined2 uVar1;
  int iVar2;
  Kit_DsdObj_t *pKVar3;
  uint *puVar4;
  Kit_DsdObj_t KVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint *pOut;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint *puVar13;
  uint *pIn;
  int Weights [16];
  
  for (uVar9 = 0; (uVar9 < p->nNodes && (pKVar3 = p->pNodes[uVar9], pKVar3 != (Kit_DsdObj_t *)0x0));
      uVar9 = uVar9 + 1) {
    KVar5 = *pKVar3;
    if (((uint)KVar5 & 0x1c0) == 0x140) {
      for (uVar12 = 0; uVar12 < (uint)KVar5 >> 0x1a; uVar12 = uVar12 + 1) {
        uVar6 = Kit_DsdLitSupport(p,(uint)*(ushort *)((long)&pKVar3[1].field_0x0 + uVar12 * 2));
        Weights[uVar12] = 0;
        iVar7 = 0;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          if ((uVar6 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
            iVar7 = iVar7 + pFreqs[lVar8] + -1;
            Weights[uVar12] = iVar7;
          }
        }
        KVar5 = *pKVar3;
      }
      uVar12 = 0xffffffffffffffff;
      iVar7 = 0;
      for (uVar10 = 0; (uint)KVar5 >> 0x1a != uVar10; uVar10 = uVar10 + 1) {
        iVar2 = Weights[uVar10];
        iVar11 = iVar7;
        if (iVar7 <= iVar2) {
          iVar11 = iVar2;
        }
        if (iVar7 < iVar2) {
          uVar12 = uVar10;
        }
        uVar12 = uVar12 & 0xffffffff;
        iVar7 = iVar11;
      }
      if ((int)uVar12 != -1) {
        puVar13 = (uint *)0x0;
        pIn = (uint *)((long)&pKVar3[1].field_0x0 + (ulong)((uint)KVar5 >> 8 & 0x3fc));
        if (((uint)KVar5 & 0x1c0) != 0x140) {
          pIn = puVar13;
        }
        uVar12 = uVar12 & 0xffffffff;
        puVar4 = p->pMem;
        while (pOut = puVar4, 0 < (int)uVar12) {
          uVar10 = uVar12 - 1;
          uVar1 = *(undefined2 *)((long)&pKVar3[1].field_0x0 + (uVar10 & 0xffffffff) * 2);
          *(undefined2 *)((long)&pKVar3[1].field_0x0 + (uVar10 & 0xffffffff) * 2) =
               *(undefined2 *)((long)&pKVar3[1].field_0x0 + uVar12 * 2);
          *(undefined2 *)((long)&pKVar3[1].field_0x0 + uVar12 * 2) = uVar1;
          Kit_TruthSwapAdjacentVars(pOut,pIn,(uint)*pKVar3 >> 0x1a,(int)uVar10);
          puVar13 = (uint *)(ulong)((int)puVar13 + 1);
          uVar12 = uVar10;
          puVar4 = pIn;
          pIn = pOut;
        }
        if (((ulong)puVar13 & 1) != 0) {
          Kit_TruthCopy(pOut,pIn,(uint)*pKVar3 >> 0x1a);
        }
      }
    }
  }
  return;
}

Assistant:

void Kit_DsdRotate( Kit_DsdNtk_t * p, int pFreqs[] )
{
    Kit_DsdObj_t * pObj;
    unsigned * pIn, * pOut, * pTemp, k;
    int i, v, Temp, uSuppFanin, iFaninLit, WeightMax, FaninMax, nSwaps;
    int Weights[16];
    // go through the prime nodes
    Kit_DsdNtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type != KIT_DSD_PRIME )
            continue;
        // count the fanin frequencies
        Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        {
            uSuppFanin = Kit_DsdLitSupport( p, iFaninLit );
            Weights[k] = 0;
            for ( v = 0; v < 16; v++ )
                if ( uSuppFanin & (1 << v) )
                    Weights[k] += pFreqs[v] - 1;
        }
        // find the most frequent fanin
        WeightMax = 0; 
        FaninMax = -1;
        for ( k = 0; k < pObj->nFans; k++ )
            if ( WeightMax < Weights[k] )
            {
                WeightMax = Weights[k];
                FaninMax = k;
            }
        // no need to reorder if there are no frequent fanins
        if ( FaninMax == -1 )
            continue;
        // move the fanins number k to the first place
        nSwaps = 0;
        pIn = Kit_DsdObjTruth(pObj);
        pOut = p->pMem;
//        for ( v = FaninMax; v < ((int)pObj->nFans)-1; v++ )
        for ( v = FaninMax-1; v >= 0; v-- )
        {
            // swap the fanins
            Temp = pObj->pFans[v];
            pObj->pFans[v] = pObj->pFans[v+1];
            pObj->pFans[v+1] = Temp;
            // swap the truth table variables
            Kit_TruthSwapAdjacentVars( pOut, pIn, pObj->nFans, v );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
            nSwaps++;
        }
        if ( nSwaps & 1 )
            Kit_TruthCopy( pOut, pIn, pObj->nFans );
    }    
}